

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

void __thiscall GGSock::ClientData::ClientData(ClientData *this)

{
  __shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  FileServer::ClientInfo::ClientInfo(&this->info);
  this->isUpdating = false;
  this->needsNewChunk = false;
  this->sendFileInfos = false;
  this->wasConnected = false;
  std::
  _Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ::_Deque_base(&(this->fileChunkRequests).
                 super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
               );
  (this->communicator).super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->communicator).super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<GGSock::Communicator,bool>((bool *)&local_28);
  std::__shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->communicator).
              super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

ClientData() {
        communicator = std::make_shared<Communicator>(false);
    }